

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O3

void preprocessor_line(dmr_C *C,stream *stream,token **line)

{
  token *ptVar1;
  uint uVar2;
  int iVar3;
  symbol *psVar4;
  token *ptVar5;
  code *pcVar6;
  token *free;
  token *ptVar7;
  
  ptVar7 = *line;
  ptVar1 = ptVar7;
  do {
    ptVar5 = ptVar1;
    ptVar1 = ptVar5->next;
  } while (((ptVar1->pos).field_0x2 & 0x10) == 0);
  *line = ptVar1;
  ptVar5->next = &dmrC_eof_token_entry_;
  ptVar7 = ptVar7->next;
  if (ptVar7 == &dmrC_eof_token_entry_) {
    return;
  }
  uVar2 = *(uint *)&ptVar7->pos & 0x3f;
  if (uVar2 == 4) {
    pcVar6 = handle_line;
LAB_00121aeb:
    if ((stream->dirty == 0) && (stream->dirty = 1, stream->ifndef == (token *)0x0)) {
      stream->protect = (ident *)0x0;
    }
    if (C->false_nesting != 0) goto LAB_00121b29;
  }
  else {
    if ((uVar2 != 2) ||
       (psVar4 = dmrC_lookup_symbol((ptVar7->field_2).ident,NS_PREPROCESSOR),
       psVar4 == (symbol *)0x0)) {
      pcVar6 = handle_nondirective;
      goto LAB_00121aeb;
    }
    pcVar6 = (psVar4->field_14).field_1.handler;
    if ((psVar4->field_14).field_1.normal != 0) goto LAB_00121aeb;
  }
  iVar3 = (*pcVar6)(C,stream,line,ptVar7);
  if (iVar3 == 0) {
    return;
  }
LAB_00121b29:
  if (((ulong)ptVar7->pos & 0x3f) != 0) {
    do {
      ptVar1 = ptVar7->next;
      dmrC_allocator_free(&C->token_allocator,ptVar7);
      ptVar7 = ptVar1;
    } while (((ulong)ptVar1->pos & 0x3f) != 0);
  }
  return;
}

Assistant:

static void preprocessor_line(struct dmr_C *C, struct stream *stream, struct token **line)
{
	struct token *start = *line, *next;
	struct token **tp = &start->next;

	for (;;) {
		next = *tp;
		if (next->pos.newline)
			break;
		tp = &next->next;
	}
	*line = next;
	*tp = &dmrC_eof_token_entry_;
	handle_preprocessor_line(C, stream, line, start);
}